

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  enet_uint16 eVar1;
  _ENetListNode *dataFirst;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var2;
  
  dataFirst = (channel->incomingReliableCommands).sentinel.next;
  p_Var2 = dataFirst;
  if (dataFirst != &(channel->incomingReliableCommands).sentinel) {
    do {
      if ((*(int *)((long)&p_Var2[4].previous + 4) != 0) ||
         (eVar1 = *(enet_uint16 *)&p_Var2[1].next,
         eVar1 != (enet_uint16)(channel->incomingReliableSequenceNumber + 1))) break;
      channel->incomingReliableSequenceNumber = eVar1;
      if (*(int *)&p_Var2[4].previous != 0) {
        channel->incomingReliableSequenceNumber = (eVar1 + (short)*(int *)&p_Var2[4].previous) - 1;
      }
      p_Var2 = p_Var2->next;
    } while (p_Var2 != &(channel->incomingReliableCommands).sentinel);
    if (p_Var2 != dataFirst) {
      channel->incomingUnreliableSequenceNumber = 0;
      enet_list_move(&(peer->dispatchedCommands).sentinel,dataFirst,p_Var2->previous);
      if (peer->needsDispatch == 0) {
        enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
        peer->needsDispatch = 1;
      }
      if ((channel->incomingUnreliableCommands).sentinel.next !=
          &(channel->incomingUnreliableCommands).sentinel) {
        enet_peer_dispatch_incoming_unreliable_commands(peer,channel);
        return;
      }
    }
  }
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_reliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator currentCommand;

    for (currentCommand = enet_list_begin (& channel -> incomingReliableCommands);
         currentCommand != enet_list_end (& channel -> incomingReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;
         
       if (incomingCommand -> fragmentsRemaining > 0 ||
           incomingCommand -> reliableSequenceNumber != (enet_uint16) (channel -> incomingReliableSequenceNumber + 1))
         break;

       channel -> incomingReliableSequenceNumber = incomingCommand -> reliableSequenceNumber;

       if (incomingCommand -> fragmentCount > 0)
         channel -> incomingReliableSequenceNumber += incomingCommand -> fragmentCount - 1;
    } 

    if (currentCommand == enet_list_begin (& channel -> incomingReliableCommands))
      return;

    channel -> incomingUnreliableSequenceNumber = 0;

    enet_list_move (enet_list_end (& peer -> dispatchedCommands), enet_list_begin (& channel -> incomingReliableCommands), enet_list_previous (currentCommand));

    if (! peer -> needsDispatch)
    {
       enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

       peer -> needsDispatch = 1;
    }

    if (! enet_list_empty (& channel -> incomingUnreliableCommands))
       enet_peer_dispatch_incoming_unreliable_commands (peer, channel);
}